

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O0

int proc_install(void)

{
  int iVar1;
  t_proc *ptVar2;
  int iVar3;
  int local_20;
  int hash;
  t_proc *ptr;
  
  ptVar2 = (t_proc *)malloc(0x78);
  if (ptVar2 == (t_proc *)0x0) {
    error("Out of memory!");
    ptr._4_4_ = 0;
  }
  else {
    strcpy(ptVar2->name,symbol + 1);
    iVar1 = symhash();
    iVar3 = 0xf1;
    if (optype == 0x2f) {
      iVar3 = 0xf2;
    }
    ptVar2->bank = iVar3;
    if (proc_ptr == (t_proc *)0x0) {
      local_20 = 0;
    }
    else {
      local_20 = loccnt;
    }
    ptVar2->base = local_20;
    ptVar2->org = ptVar2->base;
    ptVar2->size = 0;
    ptVar2->call = 0;
    ptVar2->refcnt = 0;
    ptVar2->link = (t_proc *)0x0;
    ptVar2->next = proc_tbl[iVar1];
    ptVar2->group = proc_ptr;
    ptVar2->type = optype;
    proc_ptr = ptVar2;
    proc_tbl[iVar1] = ptVar2;
    if (proc_first == (t_proc *)0x0) {
      proc_first = proc_ptr;
    }
    else {
      proc_last->link = proc_ptr;
    }
    ptr._4_4_ = 1;
    proc_last = proc_ptr;
  }
  return ptr._4_4_;
}

Assistant:

int
proc_install(void)
{
	struct t_proc *ptr;
	int hash;

	/* allocate a new proc struct */
	if ((ptr = (void *)malloc(sizeof(struct t_proc))) == NULL) {
		error("Out of memory!");
		return (0);
	}

	/* initialize it */
	strcpy(ptr->name, &symbol[1]);
	hash = symhash();
	ptr->bank = (optype == P_PGROUP)  ? GROUP_BANK : PROC_BANK;
	ptr->base = proc_ptr ? loccnt : 0;
	ptr->org = ptr->base;
	ptr->size = 0;
	ptr->call = 0;
	ptr->refcnt = 0;
	ptr->link = NULL;
	ptr->next = proc_tbl[hash];
	ptr->group = proc_ptr;
	ptr->type = optype;
	proc_ptr = ptr;
	proc_tbl[hash] = proc_ptr;

	/* link it */
	if (proc_first == NULL) {
		proc_first = proc_ptr;
		proc_last  = proc_ptr;
	}
	else {
		proc_last->link = proc_ptr;
		proc_last = proc_ptr;
	}

	/* ok */
	return (1);
}